

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O1

void __thiscall
QHeaderViewPrivate::setHiddenSectionsFromBitVector
          (QHeaderViewPrivate *this,QBitArray *sectionHidden)

{
  pointer pSVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  
  pSVar1 = QList<QHeaderViewPrivate::SectionItem>::data(&this->sectionItems);
  pcVar2 = (sectionHidden->d).d.ptr;
  lVar3 = (sectionHidden->d).d.size * 8;
  pcVar5 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)&QByteArray::_empty;
  }
  if (lVar3 != *pcVar5 && -1 < lVar3 - *pcVar5) {
    uVar4 = 0;
    do {
      *(uint *)(pSVar1 + uVar4) =
           *(uint *)(pSVar1 + uVar4) & 0xffefffff |
           (uint)(((byte)pcVar2[(uVar4 >> 3) + 1] >> ((uint)uVar4 & 7) & 1) != 0) << 0x14;
      pcVar2 = (sectionHidden->d).d.ptr;
      pcVar5 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        pcVar5 = (char *)&QByteArray::_empty;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (sectionHidden->d).d.size * 8 - (long)*pcVar5);
  }
  return;
}

Assistant:

void setHiddenSectionsFromBitVector(const QBitArray &sectionHidden) {
        SectionItem *sectionData = sectionItems.data();
        for (int i = 0; i < sectionHidden.size(); ++i)
            sectionData[i].isHidden = sectionHidden.at(i);
    }